

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functional.cpp
# Opt level: O3

void __thiscall Functional::turn(Functional *this,int id,double alpha)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  double __x;
  double dVar6;
  double dVar7;
  double dVar8;
  Group k;
  Group g;
  vector<Point,_std::allocator<Point>_> local_98;
  vector<Point,_std::allocator<Point>_> local_78;
  double local_60;
  Group local_58;
  Point local_40;
  
  std::vector<Point,_std::allocator<Point>_>::vector
            (&local_78,
             &(this->f).groups.super__Vector_base<Group,_std::allocator<Group>_>._M_impl.
              super__Vector_impl_data._M_start[id].points);
  local_98.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Point *)0x0;
  local_98.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Point *)0x0;
  if (0 < (int)((ulong)((long)local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    __x = (alpha * 3.14159265) / 180.0;
    lVar4 = 0;
    lVar5 = 0;
    do {
      dVar1 = *(double *)
               ((long)&(local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                        super__Vector_impl_data._M_start)->x + lVar4);
      dVar6 = cos(__x);
      dVar7 = sin(__x);
      dVar2 = *(double *)
               ((long)&(local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                        super__Vector_impl_data._M_start)->y + lVar4);
      dVar3 = *(double *)
               ((long)&(local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                        super__Vector_impl_data._M_start)->x + lVar4);
      local_60 = sin(__x);
      dVar8 = cos(__x);
      Point::Point(&local_40,dVar6 * dVar1 - dVar7 * dVar2,
                   local_60 * dVar3 +
                   dVar8 * *(double *)
                            ((long)&(local_78.super__Vector_base<Point,_std::allocator<Point>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->y + lVar4));
      if (local_98.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data
          ._M_finish ==
          local_98.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<Point,_std::allocator<Point>_>::_M_realloc_insert<Point>
                  (&local_98,
                   (iterator)
                   local_98.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_40);
      }
      else {
        (local_98.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_finish)->y = local_40.y;
        (local_98.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_finish)->eps = local_40.eps;
        (local_98.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_finish)->x = local_40.x;
        local_98.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_98.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x18;
    } while (lVar5 < (int)((ulong)((long)local_78.super__Vector_base<Point,_std::allocator<Point>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_78.super__Vector_base<Point,_std::allocator<Point>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x55555555);
  }
  std::vector<Point,_std::allocator<Point>_>::vector(&local_58.points,&local_98);
  Field::add(&this->f,&local_58);
  if (local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Functional::turn(int id, double alpha) {
    Group g = f.groups[id];
    Group k;
    double tmpx, tmpy;
    for (int i = 0; i < (int) g.points.size(); i++) {
        tmpx = g.points[i].x * cos(PI * alpha / 180) - sin(PI * alpha / 180) * g.points[i].y;
        tmpy = g.points[i].x * sin(PI * alpha / 180) + cos(PI * alpha / 180) * g.points[i].y;
        k.points.push_back(Point(tmpx, tmpy));

    }
    f.add(k);

}